

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_background.h
# Opt level: O3

void __thiscall SAUF_BG<UFPC>::FirstScan(SAUF_BG<UFPC> *this)

{
  uint uVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint j;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
  lVar6 = (long)*(int *)&pMVar2->field_0x8;
  uVar1 = *(uint *)&pMVar2->field_0xc;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  if (0 < lVar6) {
    lVar11 = -1;
    lVar8 = 0;
    do {
      if (0 < (int)uVar1) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_;
        pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_true>).img_labels_;
        lVar7 = *(long *)&pMVar2->field_0x10;
        lVar13 = **(long **)&pMVar2->field_0x48;
        lVar14 = lVar13 * lVar8 + lVar7;
        lVar10 = *(long *)&pMVar3->field_0x10;
        lVar9 = **(long **)&pMVar3->field_0x48;
        lVar12 = lVar9 * lVar8 + lVar10;
        lVar10 = lVar10 + lVar9 * lVar11;
        lVar7 = lVar7 + lVar13 * lVar11;
        lVar9 = 0;
        lVar13 = -1;
        do {
          if (*(char *)(lVar14 + 1 + lVar13) == '\0') {
            if ((lVar8 != 0) && (*(char *)(lVar7 + 1 + lVar13) == '\0')) {
              if ((lVar13 == -1) || (*(char *)(lVar14 + lVar13) != '\0')) goto LAB_0021ecb5;
              uVar4 = *(uint *)(lVar10 + 4 + lVar13 * 4);
              j = *(uint *)(lVar12 + lVar13 * 4);
LAB_0021ed99:
              uVar4 = UFPC::Merge(uVar4,j);
              goto LAB_0021ed41;
            }
            if ((lVar13 != -1) && (*(char *)(lVar14 + lVar13) == '\0')) {
              uVar4 = *(uint *)(lVar12 + lVar13 * 4);
              goto LAB_0021ed41;
            }
LAB_0021ed32:
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar4 = UFPC::length_;
            UFPC::length_ = UFPC::length_ + 1;
          }
          else {
            if (lVar8 == 0) {
              lVar5 = lVar13;
              if (lVar13 != -1) {
LAB_0021ecea:
                if (*(char *)(lVar14 + lVar5) != '\0') {
                  uVar4 = *(uint *)(lVar12 + lVar5 * 4);
                  goto LAB_0021ed41;
                }
              }
              goto LAB_0021ed32;
            }
            if (*(char *)(lVar7 + 1 + lVar13) == '\0') {
              if (((long)(int)uVar1 + -1 <= lVar13 + 1) || (*(char *)(lVar7 + 2 + lVar13) == '\0'))
              {
                if (lVar13 != -1) {
                  if (*(char *)(lVar7 + lVar13) != '\0') {
                    uVar4 = *(uint *)(lVar10 + lVar13 * 4);
                    goto LAB_0021ed41;
                  }
                  lVar5 = lVar9 + -1;
                  goto LAB_0021ecea;
                }
                goto LAB_0021ed32;
              }
              if (lVar13 != -1) {
                if (*(char *)(lVar7 + lVar13) == '\0') {
                  if (*(char *)(lVar14 + lVar13) == '\0') goto LAB_0021edca;
                  uVar4 = *(uint *)(lVar12 + lVar13 * 4);
                }
                else {
                  uVar4 = *(uint *)(lVar10 + lVar13 * 4);
                }
                j = *(uint *)(lVar10 + 8 + lVar13 * 4);
                goto LAB_0021ed99;
              }
LAB_0021edca:
              uVar4 = *(uint *)(lVar10 + 8 + lVar13 * 4);
            }
            else {
LAB_0021ecb5:
              uVar4 = *(uint *)(lVar10 + 4 + lVar13 * 4);
            }
          }
LAB_0021ed41:
          *(uint *)(lVar12 + 4 + lVar13 * 4) = uVar4;
          lVar9 = lVar9 + 1;
          lVar5 = lVar13 - (ulong)uVar1;
          lVar13 = lVar13 + 1;
        } while (lVar5 != -2);
      }
      lVar8 = lVar8 + 1;
      lVar11 = lVar11 + 1;
    } while (lVar8 != lVar6);
  }
  return;
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        // memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_P c > 0 && r > 0 && img_row_prev[c - 1] > 0
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_R c < w - 1 && r > 0 && img_row_prev[c + 1] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0
#define CONDITION_Q_BG r > 0 && img_row_prev[c] == 0
#define CONDITION_S_BG c > 0 && img_row[c - 1] == 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_bg_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
#undef CONDITION_Q_BG
#undef CONDITION_S_BG
    }